

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_merge.hpp
# Opt level: O2

void __thiscall
optimization::const_merge::Merge_Const::optimize_mir
          (Merge_Const *this,MirPackage *package,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
          *extra_data_repo)

{
  _Base_ptr p_Var1;
  _Self __tmp;
  
  for (p_Var1 = (package->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(package->functions)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    optimize_func(this,(MirFunction *)(p_Var1 + 2));
  }
  return;
}

Assistant:

void optimize_mir(mir::inst::MirPackage& package,
                    std::map<std::string, std::any>& extra_data_repo) {
    for (auto iter = package.functions.begin(); iter != package.functions.end();
         iter++) {
      optimize_func(iter->second);
    }
  }